

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::toUTF8
          (UnicodeString *this,int32_t start,int32_t len,char *target,int32_t capacity)

{
  char16_t *pcVar1;
  UErrorCode errorCode;
  int32_t length8;
  int32_t len_local;
  int32_t start_local;
  
  len_local = len;
  start_local = start;
  pinIndices(this,&start_local,&len_local);
  errorCode = U_ZERO_ERROR;
  pcVar1 = getBuffer(this);
  u_strToUTF8WithSub_63
            (target,capacity,&length8,pcVar1 + start_local,len_local,0xfffd,(int32_t *)0x0,
             &errorCode);
  return length8;
}

Assistant:

int32_t
UnicodeString::toUTF8(int32_t start, int32_t len,
                      char *target, int32_t capacity) const {
  pinIndices(start, len);
  int32_t length8;
  UErrorCode errorCode = U_ZERO_ERROR;
  u_strToUTF8WithSub(target, capacity, &length8,
                     getBuffer() + start, len,
                     0xFFFD,  // Standard substitution character.
                     NULL,    // Don't care about number of substitutions.
                     &errorCode);
  return length8;
}